

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int mbedtls_dhm_make_public
              (mbedtls_dhm_context *ctx,int x_size,uchar *output,size_t olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = -0x3080;
  if ((olen != 0 && ctx != (mbedtls_dhm_context *)0x0) && (olen <= ctx->len)) {
    X = &ctx->P;
    iVar3 = 0;
    iVar1 = mbedtls_mpi_cmp_int(X,0);
    if (iVar1 != 0) {
      X_00 = &ctx->X;
      do {
        mbedtls_mpi_fill_random(X_00,(long)x_size,f_rng,p_rng);
        while (iVar2 = mbedtls_mpi_cmp_mpi(X_00,X), -1 < iVar2) {
          iVar1 = mbedtls_mpi_shift_r(X_00,1);
          if (iVar1 != 0) goto LAB_0012de52;
        }
        if (iVar3 == 0xb) {
          return -0x3280;
        }
        iVar3 = iVar3 + 1;
        iVar2 = dhm_check_range(X_00,X);
      } while (iVar2 != 0);
      X_01 = &ctx->GX;
      iVar1 = mbedtls_mpi_exp_mod(X_01,&ctx->G,X_00,X,&ctx->RP);
      if (iVar1 == 0) {
        iVar2 = dhm_check_range(X_01,X);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar1 = mbedtls_mpi_write_binary(X_01,output,olen);
      }
LAB_0012de52:
      iVar2 = iVar1 + -0x3280;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_dhm_make_public( mbedtls_dhm_context *ctx, int x_size,
                     unsigned char *output, size_t olen,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret, count = 0;

    if( ctx == NULL || olen < 1 || olen > ctx->len )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( mbedtls_mpi_cmp_int( &ctx->P, 0 ) == 0 )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    /*
     * generate X and calculate GX = G^X mod P
     */
    do
    {
        mbedtls_mpi_fill_random( &ctx->X, x_size, f_rng, p_rng );

        while( mbedtls_mpi_cmp_mpi( &ctx->X, &ctx->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &ctx->X, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED );
    }
    while( dhm_check_range( &ctx->X, &ctx->P ) != 0 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->GX, &ctx->G, &ctx->X,
                          &ctx->P , &ctx->RP ) );

    if( ( ret = dhm_check_range( &ctx->GX, &ctx->P ) ) != 0 )
        return( ret );

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->GX, output, olen ) );

cleanup:

    if( ret != 0 )
        return( MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED + ret );

    return( 0 );
}